

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# knetfile.c
# Opt level: O0

int kftp_connect_file(knetFile *fp)

{
  int iVar1;
  char local_48 [8];
  char tmp [32];
  longlong file_size;
  int ret;
  knetFile *fp_local;
  
  if ((fp->fd != -1) && (close(fp->fd), fp->no_reconnect != 0)) {
    kftp_get_response(fp);
  }
  kftp_pasv_prep(fp);
  kftp_send_cmd(fp,fp->size_cmd,1);
  iVar1 = __isoc99_sscanf(fp->response,"%*d %lld",tmp + 0x18);
  if (iVar1 == 1) {
    fp->file_size = tmp._24_8_;
    if (-1 < fp->offset) {
      sprintf(local_48,"REST %lld\r\n",fp->offset);
      kftp_send_cmd(fp,local_48,1);
    }
    kftp_send_cmd(fp,fp->retr,0);
    kftp_pasv_connect(fp);
    iVar1 = kftp_get_response(fp);
    if (iVar1 == 0x96) {
      fp->is_ready = 1;
      fp_local._4_4_ = 0;
    }
    else {
      fprintf(_stderr,"[kftp_connect_file] %s\n",fp->response);
      close(fp->fd);
      fp->fd = -1;
      fp_local._4_4_ = -1;
    }
  }
  else {
    fp_local._4_4_ = -1;
  }
  return fp_local._4_4_;
}

Assistant:

int kftp_connect_file(knetFile *fp)
{
	int ret;
	long long file_size;
	if (fp->fd != -1) {
		netclose(fp->fd);
		if (fp->no_reconnect) kftp_get_response(fp);
	}
	kftp_pasv_prep(fp);
    kftp_send_cmd(fp, fp->size_cmd, 1);
#ifndef _WIN32
    // If the file does not exist, the response will be "550 Could not get file
    // size". Be silent on failure, hts_idx_load can be trying the existence of .csi or .tbi.
    if ( sscanf(fp->response,"%*d %lld", &file_size) != 1 ) return -1;
#else
	const char *p = fp->response;
	while (*p != ' ') ++p;
	while (*p < '0' || *p > '9') ++p;
	file_size = strtoint64(p);
#endif
	fp->file_size = file_size;
	if (fp->offset>=0) {
		char tmp[32];
#ifndef _WIN32
		sprintf(tmp, "REST %lld\r\n", (long long)fp->offset);
#else
		strcpy(tmp, "REST ");
		int64tostr(tmp + 5, fp->offset);
		strcat(tmp, "\r\n");
#endif
		kftp_send_cmd(fp, tmp, 1);
	}
	kftp_send_cmd(fp, fp->retr, 0);
	kftp_pasv_connect(fp);
	ret = kftp_get_response(fp);
	if (ret != 150) {
		fprintf(stderr, "[kftp_connect_file] %s\n", fp->response);
		netclose(fp->fd);
		fp->fd = -1;
		return -1;
	}
	fp->is_ready = 1;
	return 0;
}